

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var Js::TypedArrayBase::EntryFilter(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  Type ppvVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  BOOL BVar9;
  Attributes attributes;
  undefined4 *puVar10;
  TypedArrayBase *pTVar11;
  Var pvVar12;
  RecyclableObject *pRVar13;
  TempGuestArenaAllocatorObject *tempGuestAllocator;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  undefined4 extraout_var;
  JavascriptMethod p_Var14;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  Type *ppvVar15;
  uint32 i;
  uint index;
  uint32 i_1;
  uint uVar16;
  uint32 index_00;
  int in_stack_00000010;
  undefined1 local_e0 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_a8;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_90;
  RecyclableObject *local_78;
  Type local_6c;
  undefined1 local_68 [8];
  ArgumentReader args;
  Var element;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00bf8494;
    *puVar10 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_68,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_e0,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].prototype.filter",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00bf8494;
    *puVar10 = 0;
  }
  pTVar11 = ValidateTypedArray((Arguments *)local_68,pSVar2,L"[TypedArray].prototype.filter");
  if ((local_68._0_4_ & 0xfffffe) == 0) {
LAB_00bf8480:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec34,L"[TypedArray].prototype.filter");
  }
  local_6c = (pTVar11->super_ArrayBufferParent).super_ArrayObject.length;
  pvVar12 = Arguments::operator[]((Arguments *)local_68,1);
  bVar6 = JavascriptConversion::IsCallable(pvVar12);
  if (!bVar6) goto LAB_00bf8480;
  pvVar12 = Arguments::operator[]((Arguments *)local_68,1);
  pRVar13 = VarTo<Js::RecyclableObject>(pvVar12);
  if ((local_68._0_4_ & 0xffffff) < 3) {
    local_78 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    local_78 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_68,2);
  }
  args.super_Arguments.Values = (Type)0x0;
  tempGuestAllocator = ScriptContext::GetTemporaryGuestAllocator(pSVar2,L"Runtime");
  this = JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         ::New(&tempGuestAllocator->allocator,4);
  for (uVar16 = 0; local_6c != uVar16; uVar16 = uVar16 + 1) {
    iVar8 = (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTVar11,(ulong)uVar16);
    args.super_Arguments.Values = (Type)CONCAT44(extraout_var,iVar8);
    pTVar3 = pSVar2->threadContext;
    bVar6 = pTVar3->reentrancySafeOrHandled;
    pTVar3->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar3);
    ThreadContext::AssertJsReentrancy(pSVar2->threadContext);
    p_Var14 = RecyclableObject::GetEntryPoint(pRVar13);
    CheckIsExecutable(pRVar13,p_Var14);
    p_Var14 = RecyclableObject::GetEntryPoint(pRVar13);
    ppvVar5 = args.super_Arguments.Values;
    pvVar12 = JavascriptNumber::ToVar(uVar16,pSVar2);
    pvVar12 = (*p_Var14)(pRVar13,(CallInfo)pRVar13,0x2000004,0,0,0,0,0x2000004,local_78,ppvVar5,
                         pvVar12,pTVar11);
    pTVar3->reentrancySafeOrHandled = bVar6;
    BVar9 = JavascriptConversion::ToBoolean(pvVar12,pSVar2);
    if (BVar9 != 0) {
      JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      Add(this,&args.super_Arguments.Values);
    }
  }
  uVar16 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  pvVar12 = Arguments::operator[]((Arguments *)local_68,0);
  defaultConstructor = GetDefaultConstructor(pvVar12,pSVar2);
  instanceObj = (JavascriptFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)pTVar11,defaultConstructor,pSVar2);
  bVar6 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x6dd,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar6) {
LAB_00bf8494:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  pTVar3 = pSVar2->threadContext;
  local_90.constructor = (RecyclableObject *)instanceObj;
  local_90.captured = uVar16;
  local_90.scriptContext = pSVar2;
  if (instanceObj == defaultConstructor) {
    bVar6 = pTVar3->reentrancySafeOrHandled;
    pTVar3->reentrancySafeOrHandled = true;
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_90);
    pTVar3->reentrancySafeOrHandled = bVar6;
    goto LAB_00bf83b1;
  }
  local_a8._12_4_ = local_90._12_4_;
  bVar6 = pTVar3->reentrancySafeOrHandled;
  pTVar3->reentrancySafeOrHandled = true;
  local_a8.constructor = (RecyclableObject *)instanceObj;
  local_a8.captured = uVar16;
  local_a8.scriptContext = pSVar2;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
  bVar7 = ThreadContext::HasNoSideEffect(pTVar3,(RecyclableObject *)instanceObj,attributes);
  if (bVar7) {
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_a8);
    bVar7 = ThreadContext::IsOnStack(pRVar13);
LAB_00bf8302:
    if (bVar7 != false) {
      pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((pTVar3->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar13 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_a8);
      bVar7 = ThreadContext::IsOnStack(pRVar13);
      goto LAB_00bf8302;
    }
    IVar1 = pTVar3->implicitCallFlags;
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_a8);
    pTVar3->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    pTVar3->implicitCallFlags = pTVar3->implicitCallFlags | ImplicitCall_Accessor;
    pRVar13 = (((((((((instanceObj->super_DynamicObject).super_RecyclableObject.type.ptr)->
                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
  }
  pTVar3->reentrancySafeOrHandled = bVar6;
LAB_00bf83b1:
  pRVar13 = VarTo<Js::RecyclableObject>(pRVar13);
  bVar6 = VarIsImpl<Js::TypedArrayBase>(pRVar13);
  if ((bVar6) &&
     (pTVar11 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar13),
     pTVar11 != (TypedArrayBase *)0x0)) {
    for (index = 0; uVar16 != index; index = index + 1) {
      ppvVar15 = JsUtil::
                 List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this,index);
      (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTVar11,(ulong)index,*ppvVar15);
    }
  }
  else {
    for (index_00 = 0; uVar16 != index_00; index_00 = index_00 + 1) {
      ppvVar15 = JsUtil::
                 List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this,index_00);
      JavascriptOperators::OP_SetElementI_UInt32
                (pRVar13,index_00,*ppvVar15,pSVar2,PropertyOperation_ThrowIfNotExtensible);
    }
  }
  ScriptContext::ReleaseTemporaryGuestAllocator(pSVar2,tempGuestAllocator);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_e0);
  return pRVar13;
}

Assistant:

Var TypedArrayBase::EntryFilter(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.filter"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_filter);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.filter"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        Var element = nullptr;
        Var selected = nullptr;
        RecyclableObject* newObj = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            // Create a temporary list to hold the items selected by the callback function.
            // We will then iterate over this list and append those items into the object we will return.
            // We have to collect the items into this temporary list because we need to call the
            // new object constructor with a length of items and we don't know what length will be
            // until we know how many items we will collect.
            JsUtil::List<Var, ArenaAllocator>* tempList = JsUtil::List<Var, ArenaAllocator>::New(tempAlloc);

            for (uint32 k = 0; k < length; k++)
            {
                // We know that the TypedArray.HasItem will be true because k < length and we can skip the check in the TypedArray version of filter.
                element = typedArrayBase->DirectGetItem(k);

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    selected = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                    callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                    element,
                                    JavascriptNumber::ToVar(k, scriptContext),
                                    typedArrayBase);
                }
                END_SAFE_REENTRANT_CALL

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    tempList->Add(element);
                }
            }

            uint32 captured = tempList->Count();

            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            newObj = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(captured, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), captured, scriptContext);
            }));

            TypedArrayBase* newArr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            if (newArr)
            {
                // We are much more likely to have a TypedArray here than anything else

                for (uint32 i = 0; i < captured; i++)
                {
                    newArr->DirectSetItem(i, tempList->Item(i));
                }
            }
            else
            {
                for (uint32 i = 0; i < captured; i++)
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, i, tempList->Item(i), scriptContext, PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newObj;
    }